

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

RGBA deqp::gles3::Functional::FboTestUtil::getFormatThreshold(TextureFormat *format)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar5;
  uint uVar6;
  float fVar7;
  IVec4 bits;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int iVar4;
  
  tcu::getTextureFormatMantissaBitDepth((tcu *)&local_28,format);
  if (local_28 < 1) {
    uVar5 = 1;
  }
  else {
    iVar2 = 8;
    if (local_28 < 8) {
      iVar2 = local_28;
    }
    fVar7 = ceilf(510.0 / (float)~(-1 << ((byte)iVar2 & 0x1f)));
    uVar3 = 0xff;
    if ((int)fVar7 < 0xff) {
      uVar3 = (int)fVar7;
    }
    uVar5 = 0;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
  }
  if (local_24 < 1) {
    uVar3 = 0x100;
  }
  else {
    iVar2 = 8;
    if (local_24 < 8) {
      iVar2 = local_24;
    }
    fVar7 = ceilf(510.0 / (float)~(-1 << ((byte)iVar2 & 0x1f)));
    iVar2 = 0xff;
    if ((int)fVar7 < 0xff) {
      iVar2 = (int)fVar7;
    }
    iVar4 = 0;
    if (0 < iVar2) {
      iVar4 = iVar2;
    }
    uVar3 = iVar4 << 8;
  }
  if (local_20 < 1) {
    uVar6 = 0x10000;
  }
  else {
    iVar2 = 8;
    if (local_20 < 8) {
      iVar2 = local_20;
    }
    fVar7 = ceilf(510.0 / (float)~(-1 << ((byte)iVar2 & 0x1f)));
    iVar2 = 0xff;
    if ((int)fVar7 < 0xff) {
      iVar2 = (int)fVar7;
    }
    iVar4 = 0;
    if (0 < iVar2) {
      iVar4 = iVar2;
    }
    uVar6 = iVar4 << 0x10;
  }
  if (local_1c < 1) {
    uVar1 = 0x1000000;
  }
  else {
    iVar2 = 8;
    if (local_1c < 8) {
      iVar2 = local_1c;
    }
    fVar7 = ceilf(510.0 / (float)~(-1 << ((byte)iVar2 & 0x1f)));
    iVar2 = 0xff;
    if ((int)fVar7 < 0xff) {
      iVar2 = (int)fVar7;
    }
    iVar4 = 0;
    if (0 < iVar2) {
      iVar4 = iVar2;
    }
    uVar1 = iVar4 << 0x18;
  }
  return (RGBA)(uVar3 | uVar5 | uVar6 | uVar1);
}

Assistant:

tcu::RGBA getFormatThreshold (const tcu::TextureFormat& format)
{
	const tcu::IVec4 bits = tcu::getTextureFormatMantissaBitDepth(format);

	return tcu::RGBA(calculateU8ConversionError(bits.x()),
					 calculateU8ConversionError(bits.y()),
					 calculateU8ConversionError(bits.z()),
					 calculateU8ConversionError(bits.w()));
}